

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfs.cpp
# Opt level: O3

void handlegraph::algorithms::internal::dfs
               (HandleGraph *graph,function<void_(const_handlegraph::handle_t_&)> *handle_begin_fn,
               function<void_(const_handlegraph::handle_t_&)> *handle_end_fn,
               vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *sources,
               unordered_set<handlegraph::handle_t,_std::hash<handlegraph::handle_t>,_std::equal_to<handlegraph::handle_t>,_std::allocator<handlegraph::handle_t>_>
               *sinks)

{
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:217:9)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:217:9)>
             ::_M_manager;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:213:22)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:213:22)>
             ::_M_manager;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:213:22)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:213:22)>
             ::_M_manager;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:213:22)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:213:22)>
             ::_M_manager;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:213:22)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/dfs.cpp:213:22)>
             ::_M_manager;
  dfs(graph,handle_begin_fn,handle_end_fn,(function<bool_()> *)&local_38,
      (function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *)&local_58,
      (function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *)&local_78,
      (function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *)&local_98,
      (function<void_(const_std::pair<handlegraph::handle_t,_handlegraph::handle_t>_&)> *)&local_b8,
      sources,sinks);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void dfs(const HandleGraph& graph,
         const function<void(const handle_t&)>& handle_begin_fn,
         const function<void(const handle_t&)>& handle_end_fn,
         const vector<handle_t>& sources,
         const unordered_set<handle_t>& sinks) {
    auto edge_noop = [](const edge_t& e) { };
    dfs(graph,
        handle_begin_fn,
        handle_end_fn,
        [](void) { return false; },
        edge_noop,
        edge_noop,
        edge_noop,
        edge_noop,
        sources,
        sinks);
}